

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF.cc
# Opt level: O2

bool QPDF::pipeStreamData
               (shared_ptr<QPDF::EncryptionParameters> *encp,shared_ptr<InputSource> *file,
               QPDF *qpdf_for_warning,QPDFObjGen og,qpdf_offset_t offset,size_t length,
               QPDFObjectHandle stream_dict,bool is_root_metadata,Pipeline *pipeline,
               bool suppress_warnings,bool will_retry)

{
  InputSource *input;
  QPDFExc *__return_storage_ptr__;
  longlong lVar1;
  size_t __n;
  undefined7 in_stack_00000019;
  _Head_base<0UL,_Pipeline_*,_false> local_180;
  QPDFObjGen og_local;
  string local_170;
  string local_150;
  allocator<char> local_130 [32];
  size_type local_110 [4];
  __shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2> local_f0;
  __shared_ptr<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2> local_e0;
  allocator<char> local_d0 [32];
  string buf;
  
  local_180._M_head_impl = (Pipeline *)0x0;
  og_local = og;
  if (((encp->super___shared_ptr<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
      encrypted == true) {
    std::__shared_ptr<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_e0,
               &encp->super___shared_ptr<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2>);
    std::__shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_f0,&file->super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>);
    decryptStream((shared_ptr<QPDF::EncryptionParameters> *)&local_e0,
                  (shared_ptr<InputSource> *)&local_f0,qpdf_for_warning,
                  (Pipeline **)&is_root_metadata,og_local,
                  (QPDFObjectHandle *)
                  stream_dict.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                  stream_dict.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_1_
                  ,(unique_ptr<Pipeline,_std::default_delete<Pipeline>_> *)&local_180);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_f0._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_e0._M_refcount);
  }
  __n = offset;
  InputSource::read_abi_cxx11_
            ((InputSource *)&buf,
             (int)(file->super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
             (void *)length,offset);
  if (buf._M_string_length == length) {
    Pipeline::write((Pipeline *)CONCAT71(in_stack_00000019,is_root_metadata),
                    (int)buf._M_dataplus._M_p,(void *)length,__n);
    (**(code **)(*(long *)CONCAT71(in_stack_00000019,is_root_metadata) + 0x18))();
    std::__cxx11::string::~string((string *)&buf);
    if (local_180._M_head_impl != (Pipeline *)0x0) {
      (*(local_180._M_head_impl)->_vptr_Pipeline[1])();
    }
    return true;
  }
  __return_storage_ptr__ = (QPDFExc *)__cxa_allocate_exception(0x80);
  input = (file->super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_150,"",local_130);
  local_110[0] = buf._M_string_length;
  lVar1 = QIntC::IntConverter<unsigned_long,_long_long,_false,_true>::convert(local_110);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_170,"unexpected EOF reading stream data",local_d0);
  damagedPDF(__return_storage_ptr__,input,&local_150,lVar1 + offset,&local_170);
  __cxa_throw(__return_storage_ptr__,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
}

Assistant:

bool
QPDF::pipeStreamData(
    std::shared_ptr<EncryptionParameters> encp,
    std::shared_ptr<InputSource> file,
    QPDF& qpdf_for_warning,
    QPDFObjGen og,
    qpdf_offset_t offset,
    size_t length,
    QPDFObjectHandle stream_dict,
    bool is_root_metadata,
    Pipeline* pipeline,
    bool suppress_warnings,
    bool will_retry)
{
    std::unique_ptr<Pipeline> to_delete;
    if (encp->encrypted) {
        decryptStream(
            encp, file, qpdf_for_warning, pipeline, og, stream_dict, is_root_metadata, to_delete);
    }

    bool attempted_finish = false;
    try {
        auto buf = file->read(length, offset);
        if (buf.size() != length) {
            throw damagedPDF(
                *file, "", offset + toO(buf.size()), "unexpected EOF reading stream data");
        }
        pipeline->write(buf.data(), length);
        attempted_finish = true;
        pipeline->finish();
        return true;
    } catch (QPDFExc& e) {
        if (!suppress_warnings) {
            qpdf_for_warning.warn(e);
        }
    } catch (std::exception& e) {
        if (!suppress_warnings) {
            QTC::TC("qpdf", "QPDF decoding error warning");
            qpdf_for_warning.warn(
                // line-break
                damagedPDF(
                    *file,
                    "",
                    file->getLastOffset(),
                    ("error decoding stream data for object " + og.unparse(' ') + ": " +
                     e.what())));
            if (will_retry) {
                qpdf_for_warning.warn(
                    // line-break
                    damagedPDF(
                        *file,
                        "",
                        file->getLastOffset(),
                        "stream will be re-processed without filtering to avoid data loss"));
            }
        }
    }
    if (!attempted_finish) {
        try {
            pipeline->finish();
        } catch (std::exception&) {
            // ignore
        }
    }
    return false;
}